

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

Expr * primary_expr(void)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  ushort *puVar4;
  int iVar5;
  Expr *pEVar6;
  ushort **ppuVar7;
  char *name;
  Symbol *pSVar8;
  __int32_t **pp_Var9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int errn;
  char *__s1;
  ScriptFunc *pSVar13;
  byte *pbVar14;
  long lVar15;
  lword val;
  lword local_30;
  
  pbVar14 = (byte *)s;
  local_30 = 0;
  bVar2 = *s;
  uVar11 = (ulong)bVar2;
  if (uVar11 == 0x28) {
    s = s + 1;
    skip();
    pEVar6 = expression();
    if (*s == ')') {
      s = s + 1;
    }
    else {
      error(0x42,scriptname,(ulong)(uint)line,0x29);
    }
    skip();
    return pEVar6;
  }
  ppuVar7 = __ctype_b_loc();
  puVar4 = *ppuVar7;
  if ((*(byte *)((long)puVar4 + uVar11 * 2 + 1) & 8) == 0) {
    name = getarg('\x01');
    if (name == (char *)0x0) {
      iVar5 = 0x4e;
LAB_00115500:
      error(iVar5,scriptname,(ulong)(uint)line);
LAB_00115507:
      iVar5 = 0x15;
      goto LAB_00115663;
    }
    if ((*name == '.') && (name[1] == '\0')) {
      iVar5 = 0x15;
      if (caddr == -2) goto LAB_00115663;
      lVar15 = caddr;
      if (caddr == -1) {
        error(0x65,scriptname,(ulong)(uint)line);
        goto LAB_00115663;
      }
LAB_0011575e:
      iVar5 = 0x16;
      local_30 = lVar15;
      goto LAB_00115663;
    }
    pSVar8 = findsymbol(gv,(Section *)0x0,name);
    if (pSVar8 == (Symbol *)0x0) {
      if (ldFunctions[0].name != (char *)0x0) {
        pSVar13 = ldFunctions;
        __s1 = ldFunctions[0].name;
        do {
          pSVar13 = pSVar13 + 1;
          iVar5 = strcmp(__s1,name);
          if (iVar5 == 0) {
            if (caddr == -1) {
              iVar5 = 0x69;
              goto LAB_00115500;
            }
            if (caddr != -2) {
              iVar5 = (*pSVar13[-1].funcptr)(gv,caddr,&local_30);
              iVar5 = (iVar5 == 0) + 0x15;
              goto LAB_00115663;
            }
            skip();
            cVar3 = *s;
            if ((cVar3 == '\0') || (s = s + 1, cVar3 != '(')) {
              s = s + -1;
            }
            else {
              skipblock(1,'(',')');
            }
            goto LAB_00115507;
          }
          __s1 = pSVar13->name;
        } while (__s1 != (char *)0x0);
      }
      iVar5 = 0x15;
      if (caddr == -2) goto LAB_00115663;
      uVar11 = (ulong)(uint)line;
      errn = 0x68;
    }
    else {
      iVar5 = 0x15;
      if (caddr == -2) goto LAB_00115663;
      if (caddr == -1) {
        if (pSVar8->type == '\x01') {
LAB_001156e0:
          local_30 = pSVar8->value;
          goto LAB_00115663;
        }
        uVar11 = (ulong)(uint)line;
        name = pSVar8->name;
        errn = 0x66;
      }
      else {
        if (pSVar8->type == '\x02') {
          if (pSVar8->relsect->lnksec != (LinkedSection *)0x0) {
            lVar15 = pSVar8->value + pSVar8->relsect->va;
            goto LAB_0011575e;
          }
        }
        else if (pSVar8->type == '\x01') goto LAB_001156e0;
        uVar11 = (ulong)(uint)line;
        name = pSVar8->name;
        errn = 0x6a;
      }
    }
    iVar5 = 0x15;
    error(errn,scriptname,uVar11,name);
    goto LAB_00115663;
  }
  uVar10 = 10;
  if (bVar2 == 0x30) {
    if ((byte)(((char *)pbVar14)[1] | 0x20U) != 0x78) {
      uVar10 = 8;
      goto LAB_00115572;
    }
    s = (char *)pbVar14 + 2;
    uVar11 = (ulong)(byte)((char *)pbVar14)[2];
    pbVar14 = (byte *)s;
    if ((*(byte *)((long)puVar4 + uVar11 * 2 + 1) & 0x10) == 0) {
      lVar15 = 0;
    }
    else {
      lVar15 = 0;
      do {
        cVar3 = (char)uVar11;
        if ((byte)(cVar3 - 0x30U) < 10) {
          lVar15 = lVar15 * 0x10 + uVar11 + -0x30;
        }
        else if ((byte)(cVar3 + 0x9fU) < 6) {
          lVar15 = lVar15 * 0x10 + uVar11 + -0x57;
        }
        else {
          lVar15 = lVar15 * 0x10 + (long)cVar3 + -0x37;
        }
        pbVar14 = pbVar14 + 1;
        uVar11 = (ulong)*pbVar14;
        s = (char *)pbVar14;
        local_30 = lVar15;
      } while ((*(byte *)((long)puVar4 + uVar11 * 2 + 1) & 0x10) != 0);
    }
  }
  else {
LAB_00115572:
    if ((int)(char)bVar2 < (int)(uVar10 | 0x30) && '/' < (char)bVar2) {
      lVar15 = 0;
      do {
        lVar15 = lVar15 * (ulong)uVar10 + (uVar11 & 0xff) + -0x30;
        pbVar1 = pbVar14 + 1;
        uVar12 = (uint)(char)*pbVar1;
        uVar11 = (ulong)uVar12;
        pbVar14 = pbVar14 + 1;
        if ((int)uVar12 < 0x30) break;
      } while ((int)uVar12 < (int)(uVar10 | 0x30));
      uVar11 = (ulong)*pbVar1;
      s = (char *)pbVar14;
      local_30 = lVar15;
    }
    else {
      lVar15 = 0;
    }
  }
  pp_Var9 = __ctype_toupper_loc();
  iVar5 = 0x15;
  if ((*pp_Var9)[uVar11] == 0x4d) {
    local_30 = lVar15 << 0x14;
  }
  else {
    if ((*pp_Var9)[uVar11] != 0x4b) goto LAB_00115663;
    local_30 = lVar15 << 10;
  }
  s = (char *)(pbVar14 + 1);
LAB_00115663:
  skip();
  pEVar6 = (Expr *)alloc(0x20);
  pEVar6->left = (Expr *)0x0;
  pEVar6->right = (Expr *)0x0;
  pEVar6->type = iVar5;
  pEVar6->val = local_30;
  return pEVar6;
}

Assistant:

static struct Expr *primary_expr(void)
{
  lword val = 0;
  int type = ABS;
  struct Expr *new;

  if (*s == '(') {
    s++;
    skip();
    new = expression();
    if (*s != ')')
      error(66,scriptname,line,')');  /* ')' expected */
    else
      s++;
    skip();
    return new;
  }

  if (isdigit((unsigned char)*s)) {
    /* octal, decimal or hex constant */
    if (s[0]=='0' && (s[1]=='x' || s[1]=='X')) {
      s += 2;
      while (isxdigit((unsigned char)*s)) {
        if (*s>='0' && *s<='9')
          val = (val<<4) + *s++ - '0';
        else if (*s>='a' && *s<='f')
          val = (val<<4) + *s++ - 'a' + 10;
        else
          val = (val<<4) + *s++ - 'A' + 10;
      }
    }
    else {
      int base = (*s=='0') ? 8 : 10;

      while (*s>='0' && *s<('0'+base)) {
        val = base*val + *s++ - '0';
      }
    }

    if (toupper((unsigned char)*s) == 'K') {
      val <<= 10;
      s++;
    }
    else if (toupper((unsigned char)*s) == 'M') {
      val <<= 20;
      s++;
    }
  }

  else {
    char *word;

    if (word = getarg(1)) {
      if (word[0]=='.' && word[1]=='\0') {  /* current address symbol '.' */
        if (caddr != -1) {
          if (caddr != -2) {
            val = caddr;
            type = REL;
          }
        }
        else {
          /* Address symbol '.' invalid outside SECTIONS block */
          error(101,scriptname,line);
        }
      }
      else {  /* otherwise it's possibly a function- or symbol-name */
        struct Symbol *sym;

        if (sym = findsymbol(gv,NULL,word)) {
          if (caddr==-1 && sym->type!=SYM_ABS) {
            /* Reference to non-absolute symbol */
            error(102,scriptname,line,sym->name);
          }
          else if (caddr != -2) {
            if (sym->type == SYM_ABS) {
              val = sym->value;
            }
            else if (sym->type==SYM_RELOC && sym->relsect->lnksec!=NULL) {
              val = (lword)sym->relsect->va + sym->value;
              type = REL;
            }
            else {
              /* Symbol is not yet assigned */
              error(106,scriptname,line,sym->name);
            }
          }
        }
        else {
          struct ScriptFunc *sfptr;

          for (sfptr=ldFunctions; sfptr->name; sfptr++) {
            if (!strcmp(sfptr->name,word))
              break;
          }
          if (sfptr->name) {
            if (caddr == -2) {
              if (getchr() == '(')
                skipblock(1,'(',')');
              else
                back(1);
            }
            else if (caddr != -1)
              type = sfptr->funcptr(gv,caddr,&val) ? ABS : REL;
            else
              error(105,scriptname,line);  /* No function-calls allowed here */
          }
          else if (caddr != -2)
            error(104,scriptname,line,word);  /* Unknown symbol or function */
        }
      }
    }
    else
      error(78,scriptname,line);   /* missing argument */
  }

  skip();
  new = new_expr();
  new->type = type;
  new->val = val;
  return new;
}